

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

Prog * __thiscall re2::RE2::ReverseProg(RE2 *this)

{
  RE2 *local_20;
  anon_class_1_0_00000001 local_11;
  RE2 *local_10;
  RE2 *this_local;
  
  local_20 = this;
  local_10 = this;
  std::call_once<re2::RE2::ReverseProg()const::__0,re2::RE2_const*>
            (&this->rprog_once_,&local_11,&local_20);
  return this->rprog_;
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [](const RE2* re) {
    re->rprog_ =
        re->suffix_regexp_->CompileToReverseProg(re->options_.max_mem() / 3);
    if (re->rprog_ == NULL) {
      if (re->options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(*re->pattern_)
                   << "'";
      // We no longer touch error_ and error_code_ because failing to compile
      // the reverse Prog is not a showstopper: falling back to NFA execution
      // is fine. More importantly, an RE2 object is supposed to be logically
      // immutable: whatever ok() would have returned after Init() completed,
      // it should continue to return that no matter what ReverseProg() does.
    }
  }, this);
  return rprog_;
}